

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int encode_double_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,double value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  uchar local_20;
  uchar local_1f;
  uchar local_1e;
  uchar local_1d;
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  
  local_1f = (uchar)((ulong)value >> 0x38);
  iVar1 = (*encoder_output)(context,&local_1f,1);
  if (iVar1 == 0) {
    local_1e = (uchar)((ulong)value >> 0x30);
    iVar1 = (*encoder_output)(context,&local_1e,1);
    if (iVar1 == 0) {
      local_1d = (uchar)((ulong)value >> 0x28);
      iVar1 = (*encoder_output)(context,&local_1d,1);
      if (iVar1 == 0) {
        local_1c = (uchar)((ulong)value >> 0x20);
        iVar1 = (*encoder_output)(context,&local_1c,1);
        if (iVar1 == 0) {
          local_1b = (uchar)((ulong)value >> 0x18);
          iVar1 = (*encoder_output)(context,&local_1b,1);
          if (iVar1 == 0) {
            local_1a = (uchar)((ulong)value >> 0x10);
            iVar1 = (*encoder_output)(context,&local_1a,1);
            if (iVar1 == 0) {
              local_20 = (uchar)((ulong)value >> 8);
              iVar1 = (*encoder_output)(context,&local_20,1);
              if (iVar1 == 0) {
                local_19 = SUB81(value,0);
                iVar1 = (*encoder_output)(context,&local_19,1);
                if (iVar1 == 0) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
              ,"encode_double_value",0xca3,1,"Failure encoding bytes for double");
  }
  return 0xca4;
}

Assistant:

static int encode_double_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, double value)
{
    int result;

    uint64_t value_as_uint64 = *((uint64_t*)(void*)&value);
    /* Codes_SRS_AMQPVALUE_01_290: [\<encoding name="ieee-754" code="0x82" category="fixed" width="8" label="IEEE 754-2008 binary64"/>] */
    if ((output_byte(encoder_output, context, (value_as_uint64 >> 56) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 48) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 40) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 32) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 24) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 16) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 8) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64) & 0xFF) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failure encoding bytes for double");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}